

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::changeMaxObj(SPxLPBase<double> *this,int i,double *newVal,bool scale)

{
  undefined7 in_register_00000009;
  double extraout_XMM0_Qa;
  double dVar1;
  
  if ((int)CONCAT71(in_register_00000009,scale) == 0) {
    dVar1 = *newVal;
  }
  else {
    (*this->lp_scaler->_vptr_SPxScaler[0x29])(*newVal,this->lp_scaler,this,i);
    dVar1 = extraout_XMM0_Qa;
  }
  (this->super_LPColSetBase<double>).object.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start[i] = dVar1;
  return;
}

Assistant:

virtual void changeMaxObj(int i, const R& newVal, bool scale = false)
   {
      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::maxObj_w(i) = lp_scaler->scaleObj(*this, i, newVal);
      }
      else
         LPColSetBase<R>::maxObj_w(i) = newVal;

      assert(isConsistent());
   }